

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_dump_tile_info(opj_tcp_t *l_default_tile,OPJ_INT32 numcomps,FILE *out_stream)

{
  opj_tccp_t *poVar1;
  int local_40;
  int local_38;
  OPJ_INT32 numbands;
  OPJ_INT32 bandno;
  OPJ_UINT32 resno;
  opj_tccp_t *l_tccp;
  OPJ_INT32 compno;
  FILE *out_stream_local;
  OPJ_INT32 numcomps_local;
  opj_tcp_t *l_default_tile_local;
  
  if (l_default_tile != (opj_tcp_t *)0x0) {
    fprintf((FILE *)out_stream,"\t default tile {\n");
    fprintf((FILE *)out_stream,"\t\t csty=%#x\n",(ulong)l_default_tile->csty);
    fprintf((FILE *)out_stream,"\t\t prg=%#x\n",(ulong)(uint)l_default_tile->prg);
    fprintf((FILE *)out_stream,"\t\t numlayers=%d\n",(ulong)l_default_tile->numlayers);
    fprintf((FILE *)out_stream,"\t\t mct=%x\n",(ulong)l_default_tile->mct);
    for (l_tccp._4_4_ = 0; (int)l_tccp._4_4_ < numcomps; l_tccp._4_4_ = l_tccp._4_4_ + 1) {
      poVar1 = l_default_tile->tccps + (int)l_tccp._4_4_;
      fprintf((FILE *)out_stream,"\t\t comp %d {\n",(ulong)l_tccp._4_4_);
      fprintf((FILE *)out_stream,"\t\t\t csty=%#x\n",(ulong)poVar1->csty);
      fprintf((FILE *)out_stream,"\t\t\t numresolutions=%d\n",(ulong)poVar1->numresolutions);
      fprintf((FILE *)out_stream,"\t\t\t cblkw=2^%d\n",(ulong)poVar1->cblkw);
      fprintf((FILE *)out_stream,"\t\t\t cblkh=2^%d\n",(ulong)poVar1->cblkh);
      fprintf((FILE *)out_stream,"\t\t\t cblksty=%#x\n",(ulong)poVar1->cblksty);
      fprintf((FILE *)out_stream,"\t\t\t qmfbid=%d\n",(ulong)poVar1->qmfbid);
      fprintf((FILE *)out_stream,"\t\t\t preccintsize (w,h)=");
      for (numbands = 0; (uint)numbands < poVar1->numresolutions; numbands = numbands + 1) {
        fprintf((FILE *)out_stream,"(%d,%d) ",(ulong)poVar1->prcw[(uint)numbands],
                (ulong)poVar1->prch[(uint)numbands]);
      }
      fprintf((FILE *)out_stream,"\n");
      fprintf((FILE *)out_stream,"\t\t\t qntsty=%d\n",(ulong)poVar1->qntsty);
      fprintf((FILE *)out_stream,"\t\t\t numgbits=%d\n",(ulong)poVar1->numgbits);
      fprintf((FILE *)out_stream,"\t\t\t stepsizes (m,e)=");
      if (poVar1->qntsty == 1) {
        local_40 = 1;
      }
      else {
        local_40 = poVar1->numresolutions * 3 + -2;
      }
      for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
        fprintf((FILE *)out_stream,"(%d,%d) ",(ulong)(uint)poVar1->stepsizes[local_38].mant,
                (ulong)(uint)poVar1->stepsizes[local_38].expn);
      }
      fprintf((FILE *)out_stream,"\n");
      fprintf((FILE *)out_stream,"\t\t\t roishift=%d\n",(ulong)(uint)poVar1->roishift);
      fprintf((FILE *)out_stream,"\t\t }\n");
    }
    fprintf((FILE *)out_stream,"\t }\n");
  }
  return;
}

Assistant:

static void opj_j2k_dump_tile_info(opj_tcp_t * l_default_tile,
                                   OPJ_INT32 numcomps, FILE* out_stream)
{
    if (l_default_tile) {
        OPJ_INT32 compno;

        fprintf(out_stream, "\t default tile {\n");
        fprintf(out_stream, "\t\t csty=%#x\n", l_default_tile->csty);
        fprintf(out_stream, "\t\t prg=%#x\n", l_default_tile->prg);
        fprintf(out_stream, "\t\t numlayers=%d\n", l_default_tile->numlayers);
        fprintf(out_stream, "\t\t mct=%x\n", l_default_tile->mct);

        for (compno = 0; compno < numcomps; compno++) {
            opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
            OPJ_UINT32 resno;
            OPJ_INT32 bandno, numbands;

            /* coding style*/
            fprintf(out_stream, "\t\t comp %d {\n", compno);
            fprintf(out_stream, "\t\t\t csty=%#x\n", l_tccp->csty);
            fprintf(out_stream, "\t\t\t numresolutions=%d\n", l_tccp->numresolutions);
            fprintf(out_stream, "\t\t\t cblkw=2^%d\n", l_tccp->cblkw);
            fprintf(out_stream, "\t\t\t cblkh=2^%d\n", l_tccp->cblkh);
            fprintf(out_stream, "\t\t\t cblksty=%#x\n", l_tccp->cblksty);
            fprintf(out_stream, "\t\t\t qmfbid=%d\n", l_tccp->qmfbid);

            fprintf(out_stream, "\t\t\t preccintsize (w,h)=");
            for (resno = 0; resno < l_tccp->numresolutions; resno++) {
                fprintf(out_stream, "(%d,%d) ", l_tccp->prcw[resno], l_tccp->prch[resno]);
            }
            fprintf(out_stream, "\n");

            /* quantization style*/
            fprintf(out_stream, "\t\t\t qntsty=%d\n", l_tccp->qntsty);
            fprintf(out_stream, "\t\t\t numgbits=%d\n", l_tccp->numgbits);
            fprintf(out_stream, "\t\t\t stepsizes (m,e)=");
            numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 :
                       (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
            for (bandno = 0; bandno < numbands; bandno++) {
                fprintf(out_stream, "(%d,%d) ", l_tccp->stepsizes[bandno].mant,
                        l_tccp->stepsizes[bandno].expn);
            }
            fprintf(out_stream, "\n");

            /* RGN value*/
            fprintf(out_stream, "\t\t\t roishift=%d\n", l_tccp->roishift);

            fprintf(out_stream, "\t\t }\n");
        } /*end of component of default tile*/
        fprintf(out_stream, "\t }\n"); /*end of default tile*/
    }
}